

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

archive * archive_read_disk_new(void)

{
  archive_vtable_conflict *paVar1;
  archive_entry *paVar2;
  archive_read_disk *a;
  
  a = (archive_read_disk *)calloc(1,0x130);
  if (a == (archive_read_disk *)0x0) {
    a = (archive_read_disk *)0x0;
  }
  else {
    (a->archive).magic = 0xbadb0c5;
    (a->archive).state = 1;
    paVar1 = archive_read_disk_vtable();
    (a->archive).vtable = paVar1;
    paVar2 = archive_entry_new2((archive *)a);
    a->entry = paVar2;
    a->lookup_uname = trivial_lookup_uname;
    a->lookup_gname = trivial_lookup_gname;
    a->flags = 4;
    a->open_on_current_dir = open_on_current_dir;
    a->tree_current_dir_fd = tree_current_dir_fd;
    a->tree_enter_working_dir = tree_enter_working_dir;
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_read_disk_new(void)
{
	struct archive_read_disk *a;

	a = (struct archive_read_disk *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_READ_DISK_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_read_disk_vtable();
	a->entry = archive_entry_new2(&a->archive);
	a->lookup_uname = trivial_lookup_uname;
	a->lookup_gname = trivial_lookup_gname;
	a->flags = ARCHIVE_READDISK_MAC_COPYFILE;
	a->open_on_current_dir = open_on_current_dir;
	a->tree_current_dir_fd = tree_current_dir_fd;
	a->tree_enter_working_dir = tree_enter_working_dir;
	return (&a->archive);
}